

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer(int index)

{
  int in_EDI;
  layer_creator_func layer_creator;
  Layer *local_8;
  
  if ((in_EDI < 0) || (0x36 < in_EDI)) {
    local_8 = (Layer *)0x0;
  }
  else if (*(code **)(layer_registry + (long)in_EDI * 0x10 + 8) == (code *)0x0) {
    local_8 = (Layer *)0x0;
  }
  else {
    local_8 = (Layer *)(**(code **)(layer_registry + (long)in_EDI * 0x10 + 8))();
  }
  return local_8;
}

Assistant:

Layer* create_layer(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}